

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O0

string * __thiscall
viennamath::rt_latex_constant_processor<viennamath::rt_expression_interface<double>>::
process_impl_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Constant *e,bool param_2,
          rt_latex_translator<viennamath::rt_expression_interface<double>_> *param_3)

{
  ostream *poVar1;
  double dVar2;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  rt_latex_translator<viennamath::rt_expression_interface<double>_> *local_30;
  rt_latex_translator<viennamath::rt_expression_interface<double>_> *param_3_local;
  Constant *pCStack_20;
  bool param_2_local;
  Constant *e_local;
  rt_latex_constant_processor<viennamath::rt_expression_interface<double>_> *this_local;
  
  local_30 = param_3;
  param_3_local._7_1_ = param_2;
  pCStack_20 = e;
  e_local = (Constant *)this;
  this_local = (rt_latex_constant_processor<viennamath::rt_expression_interface<double>_> *)
               __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8," ");
  dVar2 = rt_constant::operator_cast_to_double((rt_constant *)pCStack_20);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  std::operator<<(poVar1," ");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string process_impl(Constant const & e, bool /*use_parenthesis*/, rt_latex_translator<InterfaceType> const & /*translator*/) const
      {
        std::stringstream ss;
        ss << " " << static_cast<NumericType>(e) << " ";
        return ss.str();
      }